

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::GatherGLSLCompile::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  GatherGLSLCompile *this_local;
  
  local_18 = this;
  this_local = (GatherGLSLCompile *)__return_storage_ptr__;
  (**(code **)(*this + 0x48))();
  std::operator+(&local_78,"#version 310 es                               \n",&local_98);
  std::operator+(&local_58,&local_78,"  void main() {                            \n");
  (**(code **)(*this + 0x50))(&local_c8);
  std::operator+(&local_38,&local_58,&local_c8);
  std::operator+(__return_storage_ptr__,&local_38,
                 "    gl_Position = vec4(1);                 \n  }                                        \n"
                );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                               \n" + Uniforms() +
			   "  void main() {                            \n" + Sampling() +
			   "    gl_Position = vec4(1);                 \n"
			   "  }                                        \n";
	}